

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromLoad
          (CopyPropagateArrays *this,Instruction *load_inst)

{
  uint *puVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  uint *puVar2;
  uint32_t uVar3;
  Instruction *this_02;
  _func_int **pp_Var4;
  Instruction *in_RDX;
  int iVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __tmp
  ;
  iterator iVar6;
  uint uVar7;
  uint32_t element_index_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components_in_reverse;
  AccessChainEntry local_50;
  uint *local_48;
  iterator iStack_40;
  uint *local_38;
  
  local_48 = (uint *)0x0;
  iStack_40._M_current = (uint *)0x0;
  local_38 = (uint *)0x0;
  this_00 = *(IRContext **)&load_inst->opcode_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar3 = (in_RDX->has_result_id_ & 1) + 1;
  if (in_RDX->has_type_id_ == false) {
    uVar3 = (uint)in_RDX->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(in_RDX,uVar3);
  this_02 = analysis::DefUseManager::GetDef(this_01,uVar3);
  while (this_02->opcode_ == OpAccessChain) {
    uVar7 = (this_02->has_result_id_ & 1) + 1;
    if (this_02->has_type_id_ == false) {
      uVar7 = (uint)this_02->has_result_id_;
    }
    iVar5 = ~uVar7 + (int)((ulong)((long)(this_02->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_02->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555;
    if (iVar5 != 0) {
      do {
        uVar7 = (this_02->has_result_id_ & 1) + 1;
        if (this_02->has_type_id_ == false) {
          uVar7 = (uint)this_02->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(this_02,uVar7 + iVar5);
        local_50._0_4_ = uVar3;
        if (iStack_40._M_current == local_38) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,iStack_40,
                     (uint *)&local_50);
        }
        else {
          *iStack_40._M_current = uVar3;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      uVar7 = (this_02->has_result_id_ & 1) + 1;
      if ((this_02->has_type_id_ & 1U) == 0) {
        uVar7 = (uint)this_02->has_result_id_;
      }
    }
    uVar3 = Instruction::GetSingleWordOperand(this_02,uVar7);
    this_02 = analysis::DefUseManager::GetDef(this_01,uVar3);
  }
  if (this_02->opcode_ == OpVariable) {
    pp_Var4 = (_func_int **)operator_new(0x20);
    puVar2 = local_48;
    *pp_Var4 = (_func_int *)this_02;
    pp_Var4[1] = (_func_int *)0x0;
    pp_Var4[2] = (_func_int *)0x0;
    pp_Var4[3] = (_func_int *)0x0;
    if (iStack_40._M_current != local_48) {
      iVar6._M_current = iStack_40._M_current;
      do {
        puVar1 = iVar6._M_current + -1;
        iVar6._M_current = iVar6._M_current + -1;
        local_50 = (AccessChainEntry)(((ulong)*puVar1 << 0x20) + 1);
        std::
        vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
        ::emplace_back<spvtools::opt::CopyPropagateArrays::AccessChainEntry>
                  ((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                    *)(pp_Var4 + 1),&local_50);
      } while (iVar6._M_current != puVar2);
    }
  }
  else {
    pp_Var4 = (_func_int **)0x0;
  }
  (this->super_MemPass).super_Pass._vptr_Pass = pp_Var4;
  if (local_48 != (uint *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromLoad(Instruction* load_inst) {
  std::vector<uint32_t> components_in_reverse;
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  Instruction* current_inst = def_use_mgr->GetDef(
      load_inst->GetSingleWordInOperand(kLoadPointerInOperand));

  // Build the access chain for the memory object by collecting the indices used
  // in the OpAccessChain instructions.  If we find a variable index, then
  // return |nullptr| because we cannot know for sure which memory location is
  // used.
  //
  // It is built in reverse order because the different |OpAccessChain|
  // instructions are visited in reverse order from which they are applied.
  while (current_inst->opcode() == spv::Op::OpAccessChain) {
    for (uint32_t i = current_inst->NumInOperands() - 1; i >= 1; --i) {
      uint32_t element_index_id = current_inst->GetSingleWordInOperand(i);
      components_in_reverse.push_back(element_index_id);
    }
    current_inst = def_use_mgr->GetDef(current_inst->GetSingleWordInOperand(0));
  }

  // If the address in the load is not constructed from an |OpVariable|
  // instruction followed by a series of |OpAccessChain| instructions, then
  // return |nullptr| because we cannot identify the owner or access chain
  // exactly.
  if (current_inst->opcode() != spv::Op::OpVariable) {
    return nullptr;
  }

  // Build the memory object.  Use |rbegin| and |rend| to put the access chain
  // back in the correct order.
  return std::unique_ptr<CopyPropagateArrays::MemoryObject>(
      new MemoryObject(current_inst, components_in_reverse.rbegin(),
                       components_in_reverse.rend()));
}